

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O3

int mxx::exscan<int,mxx::min<int>>(undefined8 x,long param_2,undefined4 param_3)

{
  int iVar1;
  int result;
  custom_op<int> op;
  int local_5c;
  custom_op<int> local_58;
  
  custom_op<int>::custom_op<mxx::min<int>>(&local_58,param_3);
  MPI_Exscan(x,&local_5c,1,local_58.m_type_copy,local_58.m_op,*(undefined8 *)(param_2 + 8));
  iVar1 = *(int *)(param_2 + 0x14);
  if (*(int *)(param_2 + 0x14) != 0) {
    iVar1 = local_5c;
  }
  custom_op<int>::~custom_op(&local_58);
  return iVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm(), const bool commutative = true) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func), commutative);
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}